

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_last(iterator *this)

{
  olc_node_ptr node;
  byte bVar1;
  undefined1 local_30 [8];
  read_critical_section parent_critical_section;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  optimistic_lock::try_read_lock((optimistic_lock *)local_30);
  if (local_30 == (undefined1  [8])0x0) {
    bVar1 = 0;
  }
  else {
    node.tagged_ptr = (this->db_->root).value._M_i.tagged_ptr;
    if (node.tagged_ptr == 0) {
      olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::try_last();
      bVar1 = parent_critical_section.version.version._7_1_;
    }
    else {
      bVar1 = try_right_most_traversal(this,node,(read_critical_section *)local_30);
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_last() {
  invalidate();  // clear the stack
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart()))
    return false;  // LCOV_EXCL_LINE
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  return try_right_most_traversal(node, parent_critical_section);
}